

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O3

IterateResult __thiscall deqp::gls::MemoryStressCase::iterate(MemoryStressCase *this)

{
  ostringstream *poVar1;
  MemObjectType objectTypes;
  int iVar2;
  TestLog *log;
  RenderContext *renderContext;
  iterator __position;
  int *piVar3;
  bool bVar4;
  deUint32 seed;
  GLenum GVar5;
  char *pcVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  IterateResult IVar11;
  qpTestResult qVar12;
  int iVar13;
  float fVar14;
  MemObjectAllocator allocator;
  undefined1 local_268 [384];
  MemObjectAllocator local_e8;
  
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  renderContext = this->m_renderCtx;
  objectTypes = this->m_objectTypes;
  seed = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  MemObjectAllocator::MemObjectAllocator
            (&local_e8,log,renderContext,objectTypes,&this->m_config,seed);
  bVar4 = MemObjectAllocator::allocUntilFailure(&local_e8);
  if (!bVar4) {
    MemObjectAllocator::clearObjects(&local_e8);
    poVar1 = (ostringstream *)(local_268 + 8);
    local_268._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Timeout. Couldn\'t exhaust memory in timelimit. Allocated ",0x39);
    std::ostream::operator<<(poVar1,local_e8.m_objectCount);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," objects.",9);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_268 + 0x78));
    IVar11 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    goto LAB_008fb96f;
  }
  if (this->m_clearAfterOOM == true) {
    glwClear(0x4500);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0x36c);
  }
  MemObjectAllocator::clearObjects(&local_e8);
  local_268._0_4_ = local_e8.m_objectCount;
  __position._M_current =
       (this->m_allocated).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_allocated).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->m_allocated,__position,(int *)local_268);
  }
  else {
    *__position._M_current = local_e8.m_objectCount;
    (this->m_allocated).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  if ((this->m_iteration != 0) && (local_e8.m_objectCount == 0)) {
    this->m_zeroAlloc = true;
  }
  poVar1 = (ostringstream *)(local_268 + 8);
  local_268._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Got error when allocation object count: ",0x28);
  std::ostream::operator<<(poVar1,local_e8.m_objectCount);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," bytes: ",8);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_268 + 0x78));
  if (local_e8.m_glError == 0x505) {
    IVar11 = STOP;
  }
  else {
    if ((local_e8.m_glError == 0) && (local_e8.m_result == RESULT_GOT_BAD_ALLOC)) {
      poVar1 = (ostringstream *)(local_268 + 8);
      local_268._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"std::bad_alloc",0xe);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_268 + 0x78));
      pcVar6 = "Memory allocation failed";
      qVar12 = QP_TEST_RESULT_RESOURCE_ERROR;
    }
    else {
      local_268._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Invalid Error ",0xe);
      pcVar6 = MemObjectAllocator::resultToString(local_e8.m_result);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_268._8_8_ + -0x18));
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar6,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," GLError: ",10);
      switch(local_e8.m_glError) {
      case 0x500:
        pcVar6 = "GL_INVALID_ENUM";
        break;
      case 0x501:
        pcVar6 = "GL_INVALID_VALUE";
        break;
      case 0x502:
        pcVar6 = "GL_INVALID_OPERATION";
        break;
      case 0x503:
      case 0x504:
switchD_008fb63e_caseD_503:
        std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_268._8_8_ + -0x18));
        goto LAB_008fb70f;
      case 0x505:
        pcVar6 = "GL_OUT_OF_MEMORY";
        break;
      case 0x506:
        pcVar6 = "GL_INVALID_FRAMEBUFFER_OPERATION";
        break;
      default:
        if (local_e8.m_glError != 0) goto switchD_008fb63e_caseD_503;
        pcVar6 = "<none>";
      }
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar6,sVar7);
LAB_008fb70f:
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_268 + 0x78));
      pcVar6 = "Fail";
      qVar12 = QP_TEST_RESULT_FAIL;
    }
    IVar11 = CONTINUE;
    tcu::TestContext::setTestResult((this->super_TestCase).super_TestNode.m_testCtx,qVar12,pcVar6);
  }
  if (this->m_iteration + 1 == this->m_iterationCount) {
    piVar3 = (this->m_allocated).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar10 = *piVar3;
    uVar8 = (uint)((ulong)((long)(this->m_allocated).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar3) >> 2);
    iVar13 = iVar10;
    if (0 < (int)uVar8) {
      uVar9 = 0;
      do {
        iVar2 = piVar3[uVar9];
        if (iVar2 < iVar10) {
          iVar10 = iVar2;
        }
        if (iVar13 < iVar2) {
          iVar13 = iVar2;
        }
        uVar9 = uVar9 + 1;
      } while ((uVar8 & 0x7fffffff) != uVar9);
    }
    if (iVar10 == 0 && iVar13 != 0) {
      poVar1 = (ostringstream *)(local_268 + 8);
      local_268._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Allocation count zero",0x15);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_268 + 0x78));
      IVar11 = CONTINUE;
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
    }
    else {
      fVar14 = (float)(iVar10 - iVar13) / (float)iVar13;
      if (fVar14 <= 50.0) {
        pcVar6 = "Pass";
        qVar12 = QP_TEST_RESULT_PASS;
      }
      else {
        poVar1 = (ostringstream *)(local_268 + 8);
        local_268._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Allocated objects max: ",0x17);
        std::ostream::operator<<(poVar1,iVar13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", min: ",7);
        std::ostream::operator<<(poVar1,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", difference: ",0xe);
        std::ostream::_M_insert<double>((double)fVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"% threshold: ",0xd);
        std::ostream::_M_insert<double>(50.0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"%",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_268 + 0x78));
        pcVar6 = "Allocation count variation";
        qVar12 = QP_TEST_RESULT_QUALITY_WARNING;
      }
      IVar11 = CONTINUE;
      tcu::TestContext::setTestResult((this->super_TestCase).super_TestNode.m_testCtx,qVar12,pcVar6)
      ;
    }
  }
  glwFinish();
  GVar5 = glwGetError();
  glu::checkError(GVar5,"glFinish()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0x3a7);
  this->m_iteration = this->m_iteration + 1;
  IVar11 = IVar11 ^ CONTINUE;
LAB_008fb96f:
  MemObjectAllocator::~MemObjectAllocator(&local_e8);
  return IVar11;
}

Assistant:

tcu::TestCase::IterateResult MemoryStressCase::iterate (void)
{
	bool			end		= false;
	tcu::TestLog&	log		= m_testCtx.getLog();

	MemObjectAllocator allocator(log, m_renderCtx, m_objectTypes, m_config, deStringHash(getName()));

	if (!allocator.allocUntilFailure())
	{
		// Allocation timed out
		allocator.clearObjects();

		log << TestLog::Message << "Timeout. Couldn't exhaust memory in timelimit. Allocated " << allocator.getObjectCount() << " objects." << TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}

	// Try to cancel rendering operations
	if (m_clearAfterOOM)
		GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT));

	allocator.clearObjects();

	m_allocated.push_back(allocator.getObjectCount());

	if (m_iteration != 0  && allocator.getObjectCount() == 0)
		m_zeroAlloc = true;

	log << TestLog::Message << "Got error when allocation object count: " << allocator.getObjectCount() << " bytes: " << allocator.getBytes() << TestLog::EndMessage;

	if ((allocator.getGLError() == 0) && (allocator.getResult() == MemObjectAllocator::RESULT_GOT_BAD_ALLOC))
	{
		log << TestLog::Message << "std::bad_alloc" << TestLog::EndMessage;
		end = true;
		m_testCtx.setTestResult(QP_TEST_RESULT_RESOURCE_ERROR, "Memory allocation failed");
	}
	else if (allocator.getGLError() != GL_OUT_OF_MEMORY)
	{
		log << TestLog::Message << "Invalid Error " << MemObjectAllocator::resultToString(allocator.getResult())
			<< " GLError: " << glErrorToString(allocator.getGLError()) <<
		TestLog::EndMessage;

		end = true;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	if ((m_iteration+1) == m_iterationCount)
	{
		int min = m_allocated[0];
		int max = m_allocated[0];

		float threshold = 50.0f;

		for (int allocNdx = 0; allocNdx < (int)m_allocated.size(); allocNdx++)
		{
			min = deMin32(m_allocated[allocNdx], min);
			max = deMax32(m_allocated[allocNdx], max);
		}

		if (min == 0 && max != 0)
		{
			log << TestLog::Message << "Allocation count zero" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
		else
		{
			const float change = (float)(min - max) / (float)(max);
			if (change > threshold)
			{
				log << TestLog::Message << "Allocated objects max: " << max << ", min: " << min << ", difference: " << change << "% threshold: " << threshold << "%" << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Allocation count variation");
			}
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		end = true;
	}

	GLU_CHECK_CALL(glFinish());

	m_iteration++;
	if (end)
		return STOP;
	else
		return CONTINUE;
}